

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddGroup.c
# Opt level: O0

void ddCreateGroup(DdManager *table,int x,int y)

{
  uint local_1c;
  int gybot;
  int y_local;
  int x_local;
  DdManager *table_local;
  
  for (local_1c = y; local_1c < table->subtables[(int)local_1c].next;
      local_1c = table->subtables[(int)local_1c].next) {
  }
  table->subtables[x].next = y;
  table->subtables[(int)local_1c].next = x;
  return;
}

Assistant:

static void
ddCreateGroup(
  DdManager * table,
  int  x,
  int  y)
{
    int  gybot;

#ifdef DD_DEBUG
    assert(y == x+1);
#endif

    /* Find bottom of second group. */
    gybot = y;
    while ((unsigned) gybot < table->subtables[gybot].next)
        gybot = table->subtables[gybot].next;

    /* Link groups. */
    table->subtables[x].next = y;
    table->subtables[gybot].next = x;

    return;

}